

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

String * asl::Url::decode(String *__return_storage_ptr__,String *q0)

{
  ulong in_RAX;
  ulong uVar1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  int iVar3;
  undefined5 uStack_38;
  char b [3];
  
  iVar3 = 0;
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
  _uStack_38 = in_RAX & 0xffffffffffffff;
  do {
    uVar1 = _uStack_38;
    if (q0->_len <= iVar3) {
      return __return_storage_ptr__;
    }
    paVar2 = &q0->field_2;
    if (q0->_size != 0) {
      paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(q0->field_2)._str;
    }
    if (paVar2->_space[iVar3] == '%') {
      if (q0->_len + -2 < iVar3) {
        return __return_storage_ptr__;
      }
      b[2] = SUB81(uVar1,7);
      _uStack_38 = CONCAT16(paVar2->_space[(long)iVar3 + 2],
                            CONCAT15(paVar2->_space[(long)iVar3 + 1],uStack_38));
      uVar1 = strtoul(b,(char **)0x0,0x10);
      String::operator+=(__return_storage_ptr__,(char)uVar1);
      iVar3 = iVar3 + 2;
    }
    else {
      String::operator+=(__return_storage_ptr__,paVar2->_space[iVar3]);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

String Url::decode(const String& q0)
{
	String q;
	char   b[3];
	b[2] = '\0';
	for (int i = 0; i < q0.length(); i++)
	{
		char c = q0[i];
		if (c == '%')
		{
			if (i > q0.length() - 2)
				break;
			b[0] = q0[i + 1];
			b[1] = q0[i + 2];
			q << (char)strtoul(b, NULL, 16);
			i += 2;
		}
		else
		q << c;
	}
#ifdef ASL_ANSI
	return utf8ToLocal(q);
#else
	return q;
#endif
}